

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbojpeg.c
# Opt level: O1

int tjDecodeYUV(tjhandle handle,uchar *srcBuf,int pad,int subsamp,uchar *dstBuf,int width,int pitch)

{
  int iVar1;
  undefined4 extraout_var;
  int iVar2;
  tjinstance *this;
  long in_FS_OFFSET;
  uchar *srcPlanes [3];
  int strides [3];
  uchar *local_58;
  uchar *local_50;
  uchar *puStack_48;
  undefined8 local_40;
  uchar *local_38;
  
  if (handle != (tjhandle)0x0) {
    *(undefined4 *)((long)handle + 0x6d0) = 0;
    if ((pad < 0 || srcBuf == (uchar *)0x0) ||
       (((width < 1 || 5 < (uint)subsamp) || (pad & pad - 1U) != 0) || (int)srcPlanes[0] < 1)) {
      builtin_strncpy((char *)((long)handle + 0x618),"nvalid a",8);
      builtin_strncpy((char *)((long)handle + 0x620),"rgument",8);
      builtin_strncpy((char *)((long)handle + 0x608),"tjDecode",8);
      builtin_strncpy((char *)((long)handle + 0x610),"YUV(): I",8);
      *(undefined4 *)((long)handle + 0x6d0) = 1;
      builtin_strncpy((char *)(in_FS_OFFSET + -0xc0),"nvalid a",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -0xb8),"rgument",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjDecode",8);
      builtin_strncpy((char *)(in_FS_OFFSET + -200),"YUV(): I",8);
      iVar1 = -1;
    }
    else {
      iVar1 = tjMCUWidth[(uint)subsamp];
      iVar2 = iVar1 + 7;
      if (-1 < iVar1) {
        iVar2 = iVar1;
      }
      iVar1 = tjMCUHeight[(uint)subsamp];
      strides[0] = ((-(iVar2 >> 3) & (width + (iVar2 >> 3)) - 1U) + pad) - 1 & -pad;
      local_58 = srcBuf;
      if (subsamp == 3) {
        strides[1] = 0;
        strides[2] = 0;
        local_50 = (uchar *)0x0;
        puStack_48 = (uchar *)0x0;
      }
      else {
        iVar2 = iVar1 + 7;
        if (-1 < iVar1) {
          iVar2 = iVar1;
        }
        local_38 = dstBuf;
        iVar1 = tjPlaneWidth(1,width,subsamp);
        local_40 = CONCAT44(extraout_var,iVar1);
        iVar1 = tjPlaneHeight(1,(int)srcPlanes[0],subsamp);
        strides[2] = ((int)local_40 + pad) - 1U & -pad;
        strides[1] = strides[2];
        local_50 = local_58 +
                   (long)(int)(-(iVar2 >> 3) & ((int)srcPlanes[0] + (iVar2 >> 3)) - 1U) *
                   (long)strides[0];
        puStack_48 = local_50 + strides[2] * iVar1;
        dstBuf = local_38;
      }
      iVar1 = tjDecodeYUVPlanes(handle,&local_58,strides,subsamp,dstBuf,width,pitch,
                                (int)srcPlanes[0],(int)srcPlanes[1],(int)srcPlanes[2]);
    }
    return iVar1;
  }
  builtin_strncpy((char *)(in_FS_OFFSET + -0xc2)," Invalid",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xba)," handle",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -0xd0),"tjDecode",8);
  builtin_strncpy((char *)(in_FS_OFFSET + -200),"YUV(): I",8);
  return -1;
}

Assistant:

DLLEXPORT int tjDecodeYUV(tjhandle handle, const unsigned char *srcBuf,
                          int pad, int subsamp, unsigned char *dstBuf,
                          int width, int pitch, int height, int pixelFormat,
                          int flags)
{
  const unsigned char *srcPlanes[3];
  int pw0, ph0, strides[3], retval = -1;
  tjinstance *this = (tjinstance *)handle;

  if (!this) THROWG("tjDecodeYUV(): Invalid handle");
  this->isInstanceError = FALSE;

  if (srcBuf == NULL || pad < 0 || !IS_POW2(pad) || subsamp < 0 ||
      subsamp >= NUMSUBOPT || width <= 0 || height <= 0)
    THROW("tjDecodeYUV(): Invalid argument");

  pw0 = tjPlaneWidth(0, width, subsamp);
  ph0 = tjPlaneHeight(0, height, subsamp);
  srcPlanes[0] = srcBuf;
  strides[0] = PAD(pw0, pad);
  if (subsamp == TJSAMP_GRAY) {
    strides[1] = strides[2] = 0;
    srcPlanes[1] = srcPlanes[2] = NULL;
  } else {
    int pw1 = tjPlaneWidth(1, width, subsamp);
    int ph1 = tjPlaneHeight(1, height, subsamp);

    strides[1] = strides[2] = PAD(pw1, pad);
    srcPlanes[1] = srcPlanes[0] + strides[0] * ph0;
    srcPlanes[2] = srcPlanes[1] + strides[1] * ph1;
  }

  return tjDecodeYUVPlanes(handle, srcPlanes, strides, subsamp, dstBuf, width,
                           pitch, height, pixelFormat, flags);

bailout:
  return retval;
}